

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::char_spec_handler::on_char(char_spec_handler *this)

{
  arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
  *this_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  size_t in_RCX;
  
  this_00 = this->formatter;
  if (this_00->specs_ != (basic_format_specs<char> *)0x0) {
    bVar1 = write_char<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      ((this_00->out_).container,this->value,this_00->specs_);
    (this->formatter->out_).container = bVar1.container;
    return;
  }
  arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
  ::write(this_00,(int)this->value,(void *)0x0,in_RCX);
  return;
}

Assistant:

void on_char() {
      if (formatter.specs_)
        formatter.out_ = write_char(formatter.out_, value, *formatter.specs_);
      else
        formatter.write(value);
    }